

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

void __thiscall
axl::sl::ArrayRef<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_>::release
          (ArrayRef<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_> *this)

{
  RefCount *in_RDI;
  
  if (in_RDI->m_freeFunc != (FreeFunc *)0x0) {
    rc::RefCount::release(in_RDI);
  }
  initialize((ArrayRef<axl::sl::Packer_*,_axl::sl::ArrayDetails<axl::sl::Packer_*>_> *)in_RDI);
  return;
}

Assistant:

void
	release() {
		if (m_hdr)
			m_hdr->release();

		initialize();
	}